

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  bool bVar1;
  function<void_(long)> *func;
  size_type sVar2;
  reference pvVar3;
  BVHBuildNode *pBVar4;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *in_RDX;
  Bounds3<float> *in_RDI;
  undefined8 in_R8;
  LBVHTreelet *treelet;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *__range1_1;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *in_stack_000000f0;
  atomic<int> orderedPrimsOffset;
  BVHBuildNode *nodes;
  int maxBVHNodes;
  int nPrimitives;
  uint32_t mask;
  int end;
  int start;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> mortonPrims;
  atomic<int> *in_stack_000001c0;
  BVHPrimitive *pi;
  const_iterator __end1;
  const_iterator __begin1;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  Bounds3f bounds;
  value_type *in_stack_fffffffffffffdd8;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *in_stack_fffffffffffffde0;
  anon_class_56_7_0065a05a *in_stack_fffffffffffffde8;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *__x;
  function<void_(long)> *in_stack_fffffffffffffdf0;
  function<void_(long)> *this_00;
  size_type in_stack_fffffffffffffdf8;
  Bounds3<float> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  int iVar5;
  Point3<float> *in_stack_fffffffffffffe28;
  undefined1 *end_00;
  __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
  local_1b0;
  function<void_(long)> *local_1a8;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> local_1a0;
  function<void_(long)> *local_188;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_178;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *local_170;
  undefined8 local_168;
  undefined4 *local_160;
  undefined1 *local_158;
  undefined4 local_12c;
  int local_128;
  int local_124;
  BVHBuildNode *local_120;
  BVHBuildNode *local_118;
  int local_10c;
  int local_108;
  uint local_104;
  int local_100;
  int local_fc;
  function<void_(long)> local_f8;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_d8;
  undefined8 *local_d0;
  undefined1 local_91;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_90;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  reference local_60;
  BVHPrimitive *local_58;
  __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
  local_50;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_20 [8];
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  Bounds3<float>::Bounds3(in_stack_fffffffffffffe00);
  local_48 = local_18;
  local_50._M_current =
       (BVHPrimitive *)
       std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::begin
                 ((vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                  in_stack_fffffffffffffdd8);
  local_58 = (BVHPrimitive *)
             std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::end
                       ((vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *)
                        in_stack_fffffffffffffdd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
               ::operator*(&local_50);
    Union<float>(in_RDI,in_stack_fffffffffffffe28);
    local_40 = local_78;
    local_38 = local_70;
    local_30 = local_68;
    __gnu_cxx::
    __normal_iterator<const_pbrt::BVHPrimitive_*,_std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>_>
    ::operator++(&local_50);
  }
  func = (function<void_(long)> *)
         std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::size(local_18);
  end_00 = &local_91;
  std::allocator<pbrt::MortonPrimitive>::allocator((allocator<pbrt::MortonPrimitive> *)0x773a3a);
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator_type *)in_stack_fffffffffffffdf0);
  std::allocator<pbrt::MortonPrimitive>::~allocator((allocator<pbrt::MortonPrimitive> *)0x773a60);
  std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::size(local_18);
  local_f8._M_invoker = (_Invoker_type)&local_90;
  local_d8 = local_18;
  local_d0 = &local_40;
  std::function<void(long)>::
  function<pbrt::BVHAggregate::buildHLBVH(pstd::pmr::polymorphic_allocator<std::byte>,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__0,void>
            (in_stack_fffffffffffffdf0,(anon_class_24_3_903895b6 *)in_stack_fffffffffffffde8);
  ParallelFor((int64_t)in_RDI,(int64_t)end_00,func);
  std::function<void_(long)>::~function((function<void_(long)> *)0x773ade);
  RadixSort(in_stack_000000f0);
  std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::vector
            ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)0x773afa);
  local_fc = 0;
  local_100 = 1;
  do {
    iVar5 = local_100;
    sVar2 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::size
                      (&local_90);
    if ((int)sVar2 < iVar5) {
      local_12c = 0;
      this_00 = &local_f8;
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::size
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)this_00);
      local_178 = local_18;
      local_170 = &local_90;
      local_168 = local_28;
      local_160 = &local_12c;
      local_158 = local_20;
      local_188 = this_00;
      std::function<void(long)>::
      function<pbrt::BVHAggregate::buildHLBVH(pstd::pmr::polymorphic_allocator<std::byte>,std::vector<pbrt::BVHPrimitive,std::allocator<pbrt::BVHPrimitive>>const&,std::atomic<int>*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>&)::__1,void>
                (this_00,in_stack_fffffffffffffde8);
      ParallelFor((int64_t)in_RDI,(int64_t)end_00,func);
      std::function<void_(long)>::~function((function<void_(long)> *)0x773dbe);
      __x = &local_1a0;
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::vector
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)0x773dd0);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::size
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)&local_f8);
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                 CONCAT44(iVar5,in_stack_fffffffffffffe10),
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_1a8 = &local_f8;
      local_1b0._M_current =
           (LBVHTreelet *)
           std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::begin
                     ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)
                      in_stack_fffffffffffffdd8);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::end
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)
                 in_stack_fffffffffffffdd8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
                            *)in_stack_fffffffffffffde0,
                           (__normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
        ::operator*(&local_1b0);
        std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::push_back
                  ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)this_00,
                   (value_type *)__x);
        __gnu_cxx::
        __normal_iterator<pbrt::LBVHTreelet_*,_std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>_>
        ::operator++(&local_1b0);
      }
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::size(&local_1a0);
      pBVar4 = buildUpperSAH((BVHAggregate *)__begin1._M_current,(Allocator)__range1,
                             (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                             __end1._M_current,pi._4_4_,(int)pi,in_stack_000001c0);
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::~vector
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)this_00);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::~vector
                ((vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> *)this_00);
      std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~vector
                ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)this_00);
      return pBVar4;
    }
    local_104 = 0x3ffc0000;
    in_stack_fffffffffffffe10 = local_100;
    sVar2 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::size
                      (&local_90);
    if (in_stack_fffffffffffffe10 == (int)sVar2) {
LAB_00773bb6:
      local_108 = local_100 - local_fc;
      local_10c = local_108 * 2 + -1;
      local_120 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::BVHBuildNode>
                            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffde0,
                             (size_t)in_stack_fffffffffffffdd8);
      local_128 = local_fc;
      local_124 = local_108;
      local_118 = local_120;
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::push_back
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_fc = local_100;
    }
    else {
      pvVar3 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::
               operator[](&local_90,(long)local_fc);
      in_stack_fffffffffffffe0c = pvVar3->mortonCode & local_104;
      pvVar3 = std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::
               operator[](&local_90,(long)local_100);
      if (in_stack_fffffffffffffe0c != (pvVar3->mortonCode & local_104)) goto LAB_00773bb6;
    }
    local_100 = local_100 + 1;
  } while( true );
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<PrimitiveHandle> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &pi : bvhPrimitives)
        bounds = Union(bounds, pi.centroid);

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].centroid);
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (int start = 0, end = 1; end <= (int)mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            int nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}